

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector4f.cpp
# Opt level: O2

void __thiscall Vector4f::Vector4f(Vector4f *this,float x,Vector3f *yzw)

{
  float fVar1;
  
  this->m_elements[0] = x;
  fVar1 = Vector3f::x(yzw);
  this->m_elements[1] = fVar1;
  fVar1 = Vector3f::y(yzw);
  this->m_elements[2] = fVar1;
  fVar1 = Vector3f::z(yzw);
  this->m_elements[3] = fVar1;
  return;
}

Assistant:

Vector4f::Vector4f( float x, const Vector3f& yzw )
{
	m_elements[0] = x;
	m_elements[1] = yzw.x();
	m_elements[2] = yzw.y();
	m_elements[3] = yzw.z();
}